

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Volume.cpp
# Opt level: O2

void idx2::Resize(volume *Vol,v3i *Dims3,allocator *Alloc)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  
  uVar4 = (Dims3->field_0).field_0.X;
  uVar2 = (Dims3->field_0).field_0.Y;
  uVar3 = (Dims3->field_0).field_0.Z;
  if ((ulong)Vol->Type < 10) {
    lVar5 = *(long *)(&DAT_00199b90 + (ulong)Vol->Type * 8);
  }
  else {
    lVar5 = 0;
  }
  lVar5 = (long)(int)uVar2 * (long)(int)uVar4 * (long)(int)uVar3 * lVar5;
  lVar1 = (Vol->Buffer).Bytes;
  if (lVar1 < lVar5) {
    if (0 < lVar1) {
      DeallocBuf(&Vol->Buffer);
    }
    AllocBuf(&Vol->Buffer,lVar5,Alloc);
    uVar4 = (Dims3->field_0).field_0.X;
    uVar2 = (Dims3->field_0).field_0.Y;
    uVar3 = (Dims3->field_0).field_0.Z;
  }
  Vol->Dims = (ulong)(uVar3 & 0x1fffff) << 0x2a |
              (ulong)(uVar2 & 0x1fffff) << 0x15 | (ulong)(uVar4 & 0x1fffff);
  return;
}

Assistant:

void
Resize(volume* Vol, const v3i& Dims3, allocator* Alloc)
{
  idx2_Assert(Vol->Type != dtype::__Invalid__);
  i64 NewSize = Prod<u64>(Dims3) * SizeOf(Vol->Type);
  if (Size(Vol->Buffer) < NewSize)
    Resize(&Vol->Buffer, NewSize, Alloc);
  SetDims(Vol, Dims3);
}